

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  ModuleField *pMVar1;
  Var local_a0;
  undefined1 auStack_58 [8];
  Location last_field_loc;
  
  if ((module->fields).size_ == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                  ,0x192,
                  "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::ModuleField>::back() [T = wabt::ModuleField]"
                 );
  }
  pMVar1 = (module->fields).last_;
  auStack_58 = (undefined1  [8])(pMVar1->loc).filename.data_;
  last_field_loc.filename.data_ = (char *)(pMVar1->loc).filename.size_;
  last_field_loc.filename.size_ = *(size_type *)&(pMVar1->loc).field_1;
  last_field_loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       *(size_t *)((long)&(pMVar1->loc).field_1 + 8);
  pMVar1 = fields->first_;
  last_field_loc.field_1._8_8_ = fields;
  if (pMVar1 != (ModuleField *)0x0) {
    do {
      if (pMVar1->type_ != Export) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::ExportModuleField, Base = wabt::ModuleField]"
                     );
      }
      Var::Var(&local_a0,index,(Location *)auStack_58);
      Var::operator=((Var *)&pMVar1[1].loc.field_1.field_0,&local_a0);
      Var::~Var(&local_a0);
      pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar1 != (ModuleField *)0x0);
  }
  Module::AppendFields(module,(ModuleFieldList *)last_field_loc.field_1._8_8_);
  return;
}

Assistant:

void AppendInlineExportFields(Module* module,
                              ModuleFieldList* fields,
                              Index index) {
  Location last_field_loc = module->fields.back().loc;

  for (ModuleField& field : *fields) {
    auto* export_field = cast<ExportModuleField>(&field);
    export_field->export_.var = Var(index, last_field_loc);
  }

  module->AppendFields(fields);
}